

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

Locale * __thiscall icu_63::Locale::operator=(Locale *this,Locale *other)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = this->fullName;
  if (this->baseName != pcVar3) {
    uprv_free_63(this->baseName);
    pcVar3 = this->fullName;
  }
  pcVar2 = this->fullNameBuffer;
  if (pcVar3 != pcVar2) {
    uprv_free_63(pcVar3);
  }
  pcVar3 = other->fullNameBuffer;
  pcVar1 = other->fullName;
  if (other->fullName == pcVar3) {
    strcpy(pcVar2,pcVar3);
    pcVar1 = pcVar2;
  }
  this->fullName = pcVar1;
  pcVar2 = other->baseName;
  if (other->baseName == other->fullName) {
    pcVar2 = pcVar1;
  }
  this->baseName = pcVar2;
  strcpy(this->language,other->language);
  strcpy(this->script,other->script);
  strcpy(this->country,other->country);
  this->variantBegin = other->variantBegin;
  this->fIsBogus = other->fIsBogus;
  other->fullName = pcVar3;
  other->baseName = pcVar3;
  return this;
}

Assistant:

Locale& Locale::operator=(Locale&& other) U_NOEXCEPT {
    if (baseName != fullName) uprv_free(baseName);
    if (fullName != fullNameBuffer) uprv_free(fullName);

    if (other.fullName == other.fullNameBuffer) {
        uprv_strcpy(fullNameBuffer, other.fullNameBuffer);
        fullName = fullNameBuffer;
    } else {
        fullName = other.fullName;
    }

    if (other.baseName == other.fullName) {
        baseName = fullName;
    } else {
        baseName = other.baseName;
    }

    uprv_strcpy(language, other.language);
    uprv_strcpy(script, other.script);
    uprv_strcpy(country, other.country);

    variantBegin = other.variantBegin;
    fIsBogus = other.fIsBogus;

    other.baseName = other.fullName = other.fullNameBuffer;

    return *this;
}